

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

void startElementNsDebug(void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces
                        ,xmlChar **namespaces,int nb_attributes,int nb_defaulted,
                        xmlChar **attributes)

{
  ulong uVar1;
  long lVar2;
  
  callbacks = callbacks + 1;
  if (noout != 0) {
    return;
  }
  fprintf(_stdout,"SAX.startElementNs(%s",localname);
  if (prefix == (xmlChar *)0x0) {
    fwrite(", NULL",6,1,_stdout);
  }
  else {
    fprintf(_stdout,", %s",prefix);
  }
  if (URI == (xmlChar *)0x0) {
    fwrite(", NULL",6,1,_stdout);
  }
  else {
    fprintf(_stdout,", \'%s\'",URI);
  }
  fprintf(_stdout,", %d",(ulong)(uint)nb_namespaces);
  if (0 < nb_namespaces && namespaces != (xmlChar **)0x0) {
    uVar1 = 0;
    do {
      fwrite(", xmlns",7,1,_stdout);
      if (namespaces[uVar1] != (xmlChar *)0x0) {
        fprintf(_stdout,":%s");
      }
      fprintf(_stdout,"=\'%s\'",namespaces[uVar1 + 1]);
      uVar1 = uVar1 + 2;
    } while (uVar1 < (uint)(nb_namespaces * 2));
  }
  fprintf(_stdout,", %d, %d",(ulong)(uint)nb_attributes,(ulong)(uint)nb_defaulted);
  if ((attributes != (xmlChar **)0x0) && (0 < nb_attributes)) {
    lVar2 = 0;
    do {
      if (attributes[lVar2 + 1] == (xmlChar *)0x0) {
        fprintf(_stdout,", %s=\'",attributes[lVar2]);
      }
      else {
        fprintf(_stdout,", %s:%s=\'");
      }
      fprintf(_stdout,"%.4s...\', %d",attributes[lVar2 + 3],
              (ulong)(uint)(*(int *)(attributes + lVar2 + 4) - (int)attributes[lVar2 + 3]));
      lVar2 = lVar2 + 5;
    } while ((int)lVar2 < nb_attributes * 5);
  }
  fwrite(")\n",2,1,_stdout);
  return;
}

Assistant:

static void
startElementNsDebug(void *ctx ATTRIBUTE_UNUSED,
                    const xmlChar *localname,
                    const xmlChar *prefix,
                    const xmlChar *URI,
		    int nb_namespaces,
		    const xmlChar **namespaces,
		    int nb_attributes,
		    int nb_defaulted,
		    const xmlChar **attributes)
{
    int i;

    callbacks++;
    if (noout)
	return;
    fprintf(stdout, "SAX.startElementNs(%s", (char *) localname);
    if (prefix == NULL)
	fprintf(stdout, ", NULL");
    else
	fprintf(stdout, ", %s", (char *) prefix);
    if (URI == NULL)
	fprintf(stdout, ", NULL");
    else
	fprintf(stdout, ", '%s'", (char *) URI);
    fprintf(stdout, ", %d", nb_namespaces);

    if (namespaces != NULL) {
        for (i = 0;i < nb_namespaces * 2;i++) {
	    fprintf(stdout, ", xmlns");
	    if (namespaces[i] != NULL)
	        fprintf(stdout, ":%s", namespaces[i]);
	    i++;
	    fprintf(stdout, "='%s'", namespaces[i]);
	}
    }
    fprintf(stdout, ", %d, %d", nb_attributes, nb_defaulted);
    if (attributes != NULL) {
        for (i = 0;i < nb_attributes * 5;i += 5) {
	    if (attributes[i + 1] != NULL)
		fprintf(stdout, ", %s:%s='", attributes[i + 1], attributes[i]);
	    else
		fprintf(stdout, ", %s='", attributes[i]);
	    fprintf(stdout, "%.4s...', %d", attributes[i + 3],
		    (int)(attributes[i + 4] - attributes[i + 3]));
	}
    }
    fprintf(stdout, ")\n");
}